

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O3

HaI32 __thiscall
HACD::WuColorQuantizer::Top(WuColorQuantizer *this,Box *cube,HaU8 dir,HaI32 pos,HaI32 *mmt)

{
  int iVar1;
  undefined7 in_register_00000011;
  int iVar2;
  
  iVar1 = (int)CONCAT71(in_register_00000011,dir);
  if (iVar1 == 0) {
    iVar1 = cube->r0 * 0x441;
    iVar2 = cube->r1 * 0x441 + pos;
    iVar2 = (mmt[cube->g1 * 0x21 + iVar2] -
            (mmt[iVar2 + cube->g0 * 0x21] + mmt[cube->g1 * 0x21 + pos + iVar1])) +
            mmt[cube->g0 * 0x21 + pos + iVar1];
  }
  else {
    if (iVar1 == 1) {
      iVar1 = cube->r1 * 0x441 + pos * 0x21;
      iVar2 = cube->r0 * 0x441 + pos * 0x21;
      return (mmt[iVar1 + cube->b1] - (mmt[iVar1 + cube->b0] + mmt[cube->b1 + iVar2])) +
             mmt[iVar2 + cube->b0];
    }
    iVar2 = 0;
    if (iVar1 == 2) {
      iVar2 = cube->g1 * 0x21 + pos * 0x441;
      iVar1 = cube->g0 * 0x21 + pos * 0x441;
      return (mmt[iVar2 + cube->b1] - (mmt[iVar2 + cube->b0] + mmt[cube->b1 + iVar1])) +
             mmt[iVar1 + cube->b0];
    }
  }
  return iVar2;
}

Assistant:

HaI32 	WuColorQuantizer::Top(Box *cube, HaU8 dir, HaI32 pos, HaI32 *mmt) 
	{
			switch(dir)
			{
			case FI_RGBA_RED:
				return( mmt[INDEX(pos, cube->g1, cube->b1)] 
				-mmt[INDEX(pos, cube->g1, cube->b0)]
				-mmt[INDEX(pos, cube->g0, cube->b1)]
				+mmt[INDEX(pos, cube->g0, cube->b0)] );
				break;
			case FI_RGBA_GREEN:
				return( mmt[INDEX(cube->r1, pos, cube->b1)] 
				-mmt[INDEX(cube->r1, pos, cube->b0)]
				-mmt[INDEX(cube->r0, pos, cube->b1)]
				+mmt[INDEX(cube->r0, pos, cube->b0)] );
				break;
			case FI_RGBA_BLUE:
				return( mmt[INDEX(cube->r1, cube->g1, pos)]
				-mmt[INDEX(cube->r1, cube->g0, pos)]
				-mmt[INDEX(cube->r0, cube->g1, pos)]
				+mmt[INDEX(cube->r0, cube->g0, pos)] );
				break;
			}

			return 0;
	}